

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::OP_SpreadArrayLiteral
          (InterpreterStackFrame *this,OpLayoutReg2Aux *playout)

{
  uint offset;
  ImplicitCallFlags flags;
  ScriptContext *pSVar1;
  ThreadContext *this_00;
  Var pvVar2;
  FunctionBody *functionBody;
  AuxArray<unsigned_int> *spreadIndices_00;
  Var result;
  ScriptContext *scriptContext;
  AuxArray<unsigned_int> *spreadIndices;
  Var instance;
  ImplicitCallFlags savedImplicitCallFlags;
  ThreadContext *threadContext;
  OpLayoutReg2Aux *playout_local;
  InterpreterStackFrame *this_local;
  
  pSVar1 = GetScriptContext(this);
  this_00 = ScriptContext::GetThreadContext(pSVar1);
  flags = ThreadContext::GetImplicitCallFlags(this_00);
  ThreadContext::ClearImplicitCallFlags(this_00);
  pvVar2 = GetReg<unsigned_int>(this,playout->R1);
  JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(pvVar2);
  offset = (playout->super_OpLayoutAuxiliary).super_OpLayoutAuxNoReg.Offset;
  functionBody = GetFunctionBody(this);
  spreadIndices_00 = ByteCodeReader::ReadAuxArray<unsigned_int>(offset,functionBody);
  pSVar1 = GetScriptContext(this);
  pvVar2 = Js::JavascriptArray::SpreadArrayArgs(pvVar2,spreadIndices_00,pSVar1);
  ThreadContext::CheckAndResetImplicitCallAccessorFlag(this_00);
  ThreadContext::AddImplicitCallFlags(this_00,flags);
  SetReg<unsigned_int>(this,(playout->super_OpLayoutAuxiliary).R0,pvVar2);
  return;
}

Assistant:

void InterpreterStackFrame::OP_SpreadArrayLiteral(const unaligned OpLayoutReg2Aux * playout)
    {
        ThreadContext* threadContext = this->GetScriptContext()->GetThreadContext();
        ImplicitCallFlags savedImplicitCallFlags = threadContext->GetImplicitCallFlags();
        threadContext->ClearImplicitCallFlags();

        Var instance = GetReg(playout->R1);
#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(instance);
#endif
        const Js::AuxArray<uint32> *spreadIndices = m_reader.ReadAuxArray<uint32>(playout->Offset, this->GetFunctionBody());
        ScriptContext* scriptContext = GetScriptContext();
        Var result = JavascriptArray::SpreadArrayArgs(instance, spreadIndices, scriptContext);

        threadContext->CheckAndResetImplicitCallAccessorFlag();
        threadContext->AddImplicitCallFlags(savedImplicitCallFlags);

        SetReg(playout->R0, result);
    }